

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  pointer pMVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  uint uVar8;
  Mat *m;
  Mat *this_00;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  _func_int *p_Var18;
  _func_int **pp_Var19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ulong uVar26;
  pointer pMVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar30 = m->elempack;
  uVar8 = m->c;
  uVar28 = (ulong)uVar8;
  iVar34 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep != 0) {
    if (iVar30 == 4) {
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 0) {
        if (0 < (int)uVar8) {
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar26 = 0;
          do {
            if (0 < iVar34) {
              sVar9 = pMVar27[1].cstep;
              sVar10 = m->cstep;
              sVar11 = m->elemsize;
              pvVar12 = m->data;
              sVar13 = pMVar27[1].elemsize;
              pvVar14 = pMVar27[1].data;
              sVar15 = this_00->cstep;
              sVar16 = this_00->elemsize;
              pvVar17 = this_00->data;
              lVar32 = 0;
              iVar30 = iVar34;
              do {
                pfVar1 = (float *)((long)pvVar14 + lVar32 + sVar9 * sVar13 * uVar26);
                pfVar2 = (float *)((long)pvVar12 + lVar32 + sVar10 * sVar11 * uVar26);
                auVar38._0_4_ = *pfVar1 * *pfVar2;
                auVar38._4_4_ = pfVar1[1] * pfVar2[1];
                auVar38._8_4_ = pfVar1[2] * pfVar2[2];
                auVar38._12_4_ = pfVar1[3] * pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26) = auVar38;
                lVar32 = lVar32 + 0x10;
                iVar30 = iVar30 + -1;
              } while (iVar30 != 0);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar28);
        }
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar26 = 2;
          do {
            if (0 < (int)uVar8) {
              pMVar27 = pMVar27 + uVar26;
              uVar29 = 0;
              do {
                if (0 < iVar34) {
                  sVar9 = pMVar27->cstep;
                  sVar10 = pMVar27->elemsize;
                  pvVar12 = pMVar27->data;
                  lVar32 = this_00->cstep * this_00->elemsize * uVar29;
                  pvVar14 = this_00->data;
                  lVar33 = 0;
                  iVar30 = iVar34;
                  do {
                    pfVar1 = (float *)((long)pvVar12 + lVar33 + sVar9 * sVar10 * uVar29);
                    pfVar2 = (float *)((long)pvVar14 + lVar33 + lVar32);
                    auVar35._0_4_ = *pfVar1 * *pfVar2;
                    auVar35._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar35._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar35._12_4_ = pfVar1[3] * pfVar2[3];
                    *(undefined1 (*) [16])((long)pvVar14 + lVar33 + lVar32) = auVar35;
                    lVar33 = lVar33 + 0x10;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar28);
            }
            uVar26 = uVar26 + 1;
            pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar26 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar27 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var18 = this->_vptr_Eltwise_x86[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var18) == 1) {
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var18) == 0) {
          if (0 < (int)uVar8) {
            uVar26 = 0;
            do {
              if (0 < iVar34) {
                sVar9 = pMVar27[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar12 = m->data;
                sVar13 = pMVar27[1].elemsize;
                pvVar14 = pMVar27[1].data;
                sVar15 = this_00->cstep;
                sVar16 = this_00->elemsize;
                pvVar17 = this_00->data;
                lVar32 = 0;
                iVar30 = iVar34;
                do {
                  pfVar1 = (float *)((long)pvVar14 + lVar32 + sVar9 * sVar13 * uVar26);
                  pfVar2 = (float *)((long)pvVar12 + lVar32 + sVar10 * sVar11 * uVar26);
                  auVar36._0_4_ = *pfVar1 + *pfVar2;
                  auVar36._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar36._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar36._12_4_ = pfVar1[3] + pfVar2[3];
                  *(undefined1 (*) [16])((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26) =
                       auVar36;
                  lVar32 = lVar32 + 0x10;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar28);
          }
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                         -0x71c71c71c71c71c7)) {
            uVar26 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar27 = pMVar27 + uVar26;
                uVar29 = 0;
                do {
                  if (0 < iVar34) {
                    sVar9 = pMVar27->cstep;
                    sVar10 = pMVar27->elemsize;
                    pvVar12 = pMVar27->data;
                    lVar32 = this_00->cstep * this_00->elemsize * uVar29;
                    pvVar14 = this_00->data;
                    lVar33 = 0;
                    iVar30 = iVar34;
                    do {
                      pfVar1 = (float *)((long)pvVar12 + lVar33 + sVar9 * sVar10 * uVar29);
                      pfVar2 = (float *)((long)pvVar14 + lVar33 + lVar32);
                      auVar37._0_4_ = *pfVar1 + *pfVar2;
                      auVar37._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar37._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar37._12_4_ = pfVar1[3] + pfVar2[3];
                      *(undefined1 (*) [16])((long)pvVar14 + lVar33 + lVar32) = auVar37;
                      lVar33 = lVar33 + 0x10;
                      iVar30 = iVar30 + -1;
                    } while (iVar30 != 0);
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 != uVar28);
              }
              uVar26 = uVar26 + 1;
              pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar26 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar27 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar8) {
            fVar5 = **(float **)(&this->field_0xd8 + (long)p_Var18);
            fVar6 = (*(float **)(&this->field_0xd8 + (long)p_Var18))[1];
            uVar26 = 0;
            do {
              if (0 < iVar34) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar27[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar27[1].elemsize;
                pvVar14 = pMVar27[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar32 = 0;
                iVar30 = iVar34;
                do {
                  pfVar1 = (float *)((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26);
                  fVar20 = pfVar1[1];
                  fVar21 = pfVar1[2];
                  fVar22 = pfVar1[3];
                  pfVar2 = (float *)((long)pvVar14 + lVar32 + sVar10 * sVar13 * uVar26);
                  fVar23 = pfVar2[1];
                  fVar24 = pfVar2[2];
                  fVar25 = pfVar2[3];
                  pfVar3 = (float *)((long)pvVar12 + lVar32 + sVar9 * sVar11 * uVar26);
                  *pfVar3 = *pfVar2 * fVar6 + *pfVar1 * fVar5;
                  pfVar3[1] = fVar23 * fVar6 + fVar20 * fVar5;
                  pfVar3[2] = fVar24 * fVar6 + fVar21 * fVar5;
                  pfVar3[3] = fVar25 * fVar6 + fVar22 * fVar5;
                  lVar32 = lVar32 + 0x10;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar28);
          }
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                         -0x71c71c71c71c71c7)) {
            pp_Var19 = this->_vptr_Eltwise_x86;
            uVar26 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar27 = pMVar27 + uVar26;
                fVar5 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var19[-3]) + uVar26 * 4);
                uVar29 = 0;
                do {
                  if (0 < iVar34) {
                    lVar32 = this_00->cstep * this_00->elemsize * uVar29;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar27->cstep;
                    sVar10 = pMVar27->elemsize;
                    pvVar14 = pMVar27->data;
                    lVar33 = 0;
                    iVar30 = iVar34;
                    do {
                      pfVar1 = (float *)((long)pvVar14 + lVar33 + sVar9 * sVar10 * uVar29);
                      fVar6 = pfVar1[1];
                      fVar20 = pfVar1[2];
                      fVar21 = pfVar1[3];
                      pfVar2 = (float *)((long)pvVar12 + lVar33 + lVar32);
                      fVar22 = pfVar2[1];
                      fVar23 = pfVar2[2];
                      fVar24 = pfVar2[3];
                      pfVar3 = (float *)((long)pvVar12 + lVar33 + lVar32);
                      *pfVar3 = *pfVar1 * fVar5 + *pfVar2;
                      pfVar3[1] = fVar6 * fVar5 + fVar22;
                      pfVar3[2] = fVar20 * fVar5 + fVar23;
                      pfVar3[3] = fVar21 * fVar5 + fVar24;
                      lVar33 = lVar33 + 0x10;
                      iVar30 = iVar30 + -1;
                    } while (iVar30 != 0);
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 != uVar28);
              }
              uVar26 = uVar26 + 1;
              pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar26 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar27 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar8) {
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar26 = 0;
        do {
          if (0 < iVar34) {
            sVar9 = this_00->cstep;
            sVar10 = pMVar27[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar12 = this_00->data;
            sVar13 = pMVar27[1].elemsize;
            pvVar14 = pMVar27[1].data;
            sVar15 = m->cstep;
            sVar16 = m->elemsize;
            pvVar17 = m->data;
            lVar32 = 0;
            iVar30 = iVar34;
            do {
              auVar38 = maxps(*(undefined1 (*) [16])
                               ((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26),
                              *(undefined1 (*) [16])
                               ((long)pvVar14 + lVar32 + sVar10 * sVar13 * uVar26));
              *(undefined1 (*) [16])((long)pvVar12 + lVar32 + sVar9 * sVar11 * uVar26) = auVar38;
              lVar32 = lVar32 + 0x10;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar28);
      }
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                 -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar26 = 2;
      do {
        if (0 < (int)uVar8) {
          pMVar27 = pMVar27 + uVar26;
          uVar29 = 0;
          do {
            if (0 < iVar34) {
              lVar32 = this_00->cstep * this_00->elemsize * uVar29;
              pvVar12 = this_00->data;
              sVar9 = pMVar27->cstep;
              sVar10 = pMVar27->elemsize;
              pvVar14 = pMVar27->data;
              lVar33 = 0;
              iVar30 = iVar34;
              do {
                auVar38 = maxps(*(undefined1 (*) [16])((long)pvVar12 + lVar33 + lVar32),
                                *(undefined1 (*) [16])
                                 ((long)pvVar14 + lVar33 + sVar9 * sVar10 * uVar29));
                *(undefined1 (*) [16])((long)pvVar12 + lVar33 + lVar32) = auVar38;
                lVar33 = lVar33 + 0x10;
                iVar30 = iVar30 + -1;
              } while (iVar30 != 0);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar28);
        }
        uVar26 = uVar26 + 1;
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar26 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27 >>
                                3) * -0x71c71c71c71c71c7));
    }
    else {
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 0) {
        if (0 < (int)uVar8) {
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar26 = 0;
          do {
            if (0 < iVar34) {
              sVar9 = this_00->cstep;
              sVar10 = pMVar27[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar27[1].elemsize;
              pvVar14 = pMVar27[1].data;
              sVar15 = m->cstep;
              sVar16 = m->elemsize;
              pvVar17 = m->data;
              lVar32 = 0;
              iVar30 = iVar34 + 1;
              do {
                *(float *)((long)pvVar12 + lVar32 + sVar9 * sVar11 * uVar26) =
                     *(float *)((long)pvVar14 + lVar32 + sVar10 * sVar13 * uVar26) *
                     *(float *)((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26);
                iVar30 = iVar30 + -1;
                lVar32 = lVar32 + 4;
              } while (1 < iVar30);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar28);
        }
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar26 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                 -0x71c71c71c71c71c7;
        if (2 < uVar26) {
          uVar29 = 2;
          do {
            if (0 < (int)uVar8) {
              pMVar4 = pMVar27 + uVar29;
              uVar31 = 0;
              do {
                if (0 < iVar34) {
                  lVar32 = this_00->cstep * this_00->elemsize * uVar31;
                  pvVar12 = this_00->data;
                  sVar9 = pMVar4->cstep;
                  sVar10 = pMVar4->elemsize;
                  pvVar14 = pMVar4->data;
                  lVar33 = 0;
                  iVar30 = iVar34 + 1;
                  do {
                    *(float *)((long)pvVar12 + lVar33 + lVar32) =
                         *(float *)((long)pvVar12 + lVar33 + lVar32) *
                         *(float *)((long)pvVar14 + lVar33 + sVar9 * sVar10 * uVar31);
                    iVar30 = iVar30 + -1;
                    lVar33 = lVar33 + 4;
                  } while (1 < iVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar28);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar26);
        }
      }
      p_Var18 = this->_vptr_Eltwise_x86[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var18) == 1) {
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var18) == 0) {
          if (0 < (int)uVar8) {
            uVar26 = 0;
            do {
              if (0 < iVar34) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar27[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar27[1].elemsize;
                pvVar14 = pMVar27[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar32 = 0;
                iVar30 = iVar34 + 1;
                do {
                  *(float *)((long)pvVar12 + lVar32 + sVar9 * sVar11 * uVar26) =
                       *(float *)((long)pvVar14 + lVar32 + sVar10 * sVar13 * uVar26) +
                       *(float *)((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26);
                  iVar30 = iVar30 + -1;
                  lVar32 = lVar32 + 4;
                } while (1 < iVar30);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar28);
          }
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar26 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar26) {
            uVar29 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar4 = pMVar27 + uVar29;
                uVar31 = 0;
                do {
                  if (0 < iVar34) {
                    lVar32 = this_00->cstep * this_00->elemsize * uVar31;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar4->cstep;
                    sVar10 = pMVar4->elemsize;
                    pvVar14 = pMVar4->data;
                    lVar33 = 0;
                    iVar30 = iVar34 + 1;
                    do {
                      *(float *)((long)pvVar12 + lVar33 + lVar32) =
                           *(float *)((long)pvVar12 + lVar33 + lVar32) +
                           *(float *)((long)pvVar14 + lVar33 + sVar9 * sVar10 * uVar31);
                      iVar30 = iVar30 + -1;
                      lVar33 = lVar33 + 4;
                    } while (1 < iVar30);
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar31 != uVar28);
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 != uVar26);
          }
        }
        else {
          if (0 < (int)uVar8) {
            uVar7 = **(undefined8 **)(&this->field_0xd8 + (long)p_Var18);
            uVar26 = 0;
            do {
              if (0 < iVar34) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar27[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar27[1].elemsize;
                pvVar14 = pMVar27[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar32 = 0;
                iVar30 = iVar34 + 1;
                do {
                  *(float *)((long)pvVar12 + lVar32 + sVar9 * sVar11 * uVar26) =
                       *(float *)((long)pvVar14 + lVar32 + sVar10 * sVar13 * uVar26) *
                       (float)((ulong)uVar7 >> 0x20) +
                       *(float *)((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26) * (float)uVar7;
                  iVar30 = iVar30 + -1;
                  lVar32 = lVar32 + 4;
                } while (1 < iVar30);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar28);
          }
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar26 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar26) {
            pp_Var19 = this->_vptr_Eltwise_x86;
            uVar29 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar4 = pMVar27 + uVar29;
                fVar5 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var19[-3]) + uVar29 * 4);
                uVar31 = 0;
                do {
                  if (0 < iVar34) {
                    lVar32 = this_00->cstep * this_00->elemsize * uVar31;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar4->cstep;
                    sVar10 = pMVar4->elemsize;
                    pvVar14 = pMVar4->data;
                    lVar33 = 0;
                    iVar30 = iVar34 + 1;
                    do {
                      *(float *)((long)pvVar12 + lVar33 + lVar32) =
                           *(float *)((long)pvVar14 + lVar33 + sVar9 * sVar10 * uVar31) * fVar5 +
                           *(float *)((long)pvVar12 + lVar33 + lVar32);
                      iVar30 = iVar30 + -1;
                      lVar33 = lVar33 + 4;
                    } while (1 < iVar30);
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar31 != uVar28);
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 != uVar26);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar8) {
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar26 = 0;
        do {
          if (0 < iVar34) {
            sVar9 = this_00->cstep;
            sVar10 = pMVar27[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar12 = this_00->data;
            sVar13 = pMVar27[1].elemsize;
            pvVar14 = pMVar27[1].data;
            sVar15 = m->cstep;
            sVar16 = m->elemsize;
            pvVar17 = m->data;
            lVar32 = 0;
            iVar30 = iVar34 + 1;
            do {
              fVar6 = *(float *)((long)pvVar14 + lVar32 + sVar10 * sVar13 * uVar26);
              fVar5 = *(float *)((long)pvVar17 + lVar32 + sVar15 * sVar16 * uVar26);
              if (fVar6 <= fVar5) {
                fVar6 = fVar5;
              }
              *(float *)((long)pvVar12 + lVar32 + sVar9 * sVar11 * uVar26) = fVar6;
              iVar30 = iVar30 + -1;
              lVar32 = lVar32 + 4;
            } while (1 < iVar30);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar28);
      }
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar26 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar26 < 3) {
        return 0;
      }
      uVar29 = 2;
      do {
        if (0 < (int)uVar8) {
          pMVar4 = pMVar27 + uVar29;
          uVar31 = 0;
          do {
            if (0 < iVar34) {
              lVar32 = this_00->cstep * this_00->elemsize * uVar31;
              pvVar12 = this_00->data;
              sVar9 = pMVar4->cstep;
              sVar10 = pMVar4->elemsize;
              pvVar14 = pMVar4->data;
              lVar33 = 0;
              iVar30 = iVar34 + 1;
              do {
                fVar6 = *(float *)((long)pvVar12 + lVar33 + lVar32);
                fVar5 = *(float *)((long)pvVar14 + lVar33 + sVar9 * sVar10 * uVar31);
                if (fVar6 <= fVar5) {
                  fVar6 = fVar5;
                }
                *(float *)((long)pvVar12 + lVar33 + lVar32) = fVar6;
                iVar30 = iVar30 + -1;
                lVar33 = lVar33 + 4;
              } while (1 < iVar30);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar28);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar26);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}